

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O1

baseHolder * __thiscall
cs_impl::any::holder<cs_impl::fiber::Channel<cs_impl::any>_>::duplicate
          (holder<cs_impl::fiber::Channel<cs_impl::any>_> *this)

{
  baseHolder *pbVar1;
  
  if ((DAT_00263bb8 == 0) || (cs::global_thread_counter != 0)) {
    pbVar1 = (baseHolder *)operator_new(0x28);
  }
  else {
    pbVar1 = *(baseHolder **)
              (&holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>::allocator +
              DAT_00263bb8 * 8);
    DAT_00263bb8 = DAT_00263bb8 + -1;
  }
  pbVar1->_vptr_baseHolder = (_func_int **)&PTR__holder_0025ade8;
  std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>::list
            ((list<cs_impl::any,_std::allocator<cs_impl::any>_> *)(pbVar1 + 1),&(this->mDat)._list);
  *(routine_t *)&pbVar1[4]._vptr_baseHolder = (this->mDat)._taker;
  return pbVar1;
}

Assistant:

baseHolder *duplicate() override
			{
				return allocator.alloc(mDat);
			}